

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O1

int skip_blank(char **pp,char *end)

{
  byte bVar1;
  int in_EAX;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  bool bVar5;
  
  pbVar3 = (byte *)*pp;
  if (pbVar3 == (byte *)end) {
    bVar5 = false;
  }
  else {
    do {
      bVar1 = *pbVar3;
      if (bVar1 < 0x2f) {
        iVar4 = 4;
        if ((bVar1 != 9) && (bVar1 != 0x20)) {
LAB_001644c7:
          if (((bVar1 == 0xd) || (bVar1 == 10)) &&
             ((pbVar3 + 1 != (byte *)end && (pbVar3[1] == 10)))) {
            pbVar3 = pbVar3 + 1;
          }
          in_EAX = (int)(char)bVar1;
          *pp = (char *)pbVar3;
          if (bVar1 == 10 || bVar1 == 0xd) {
            in_EAX = 0x100;
          }
          iVar4 = 1;
        }
      }
      else {
        if ((bVar1 != 0x3b) &&
           (((bVar1 != 0x2f || (pbVar3 + 1 == (byte *)end)) || (pbVar3[1] != 0x2f))))
        goto LAB_001644c7;
        pbVar2 = pbVar3 + 1;
        do {
          pbVar3 = pbVar2;
          if (pbVar3 == (byte *)end) {
            iVar4 = 8;
            pbVar3 = (byte *)end;
            goto LAB_00164511;
          }
          pbVar2 = pbVar3 + 1;
        } while ((*pbVar3 != 0xd) && (*pbVar3 != 10));
        if ((pbVar2 != (byte *)end) && (*pbVar2 == 10)) {
          pbVar3 = pbVar2;
        }
        *pp = (char *)pbVar3;
        iVar4 = 1;
        in_EAX = 0x100;
      }
LAB_00164511:
      if ((bVar1 != 0x20) && (bVar1 != 9)) goto LAB_00164533;
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (byte *)end);
    iVar4 = 2;
LAB_00164533:
    bVar5 = iVar4 == 1;
  }
  if (!bVar5) {
    *pp = end;
    in_EAX = 0x101;
  }
  return in_EAX;
}

Assistant:

static int skip_blank(const char** pp, const char* end)
{
	for (const char* p = *pp; p != end; ++p) {
		int c = *p;
		if (c == ' ' || c == '\t') {
			// skip whitespace
			continue;
		}
		if (c == ';' || (c == '/' && (p + 1) != end && *(p + 1) == '/')) {
			// skip comment
			for (++p;; ++p) {
				if (p == end)
					goto eof_reached;
				c = *p;
				if (is_eol(c)) {
					if ((p + 1) != end && *(p + 1) == '\n')
						p++;
					*pp = p;
					return IF_EOL;
				}
			}
		}
		if (is_eol(c) && (p + 1) != end && *(p + 1) == '\n')
			p++;
		*pp = p;
		return is_eol(c)? IF_EOL : c;
	}
eof_reached:
	*pp = end;
	return IF_EOF;
}